

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManComputeCutLo(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *Entry;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut;
  Aig_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    Entry = Vec_PtrEntry(p->vCis,local_24);
    Vec_PtrPush(p_00,Entry);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLo( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_PtrPush( vMinCut, pObj );
    return vMinCut;
}